

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::http_parser::parse_chunk_header
          (http_parser *this,span<const_char> buf,int64_t *chunk_size,int *header_size)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  reference __x;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar6;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var7;
  char local_1c1;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  undefined1 local_170 [8];
  string value;
  undefined1 local_130 [8];
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  iterator __end4;
  iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  size_type separator;
  char *line_end;
  string line;
  char local_99;
  undefined1 local_98 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tail_headers;
  char *pcStack_60;
  int digit;
  char *i;
  int64_t size;
  char *local_48;
  char *newline;
  char *pos;
  int *header_size_local;
  int64_t *chunk_size_local;
  http_parser *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (http_parser *)buf.m_ptr;
  pos = (char *)header_size;
  header_size_local = (int *)chunk_size;
  chunk_size_local = &this->m_recv_pos;
  pcVar2 = span<const_char>::data((span<const_char> *)&this_local);
  newline = pcVar2;
  pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
  if ((pcVar2 < pcVar3) && (*newline == '\r')) {
    newline = newline + 1;
  }
  pcVar2 = newline;
  pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
  if ((pcVar2 < pcVar3) && (*newline == '\n')) {
    newline = newline + 1;
  }
  pcVar2 = newline;
  pcVar4 = span<const_char>::end((span<const_char> *)&this_local);
  pcVar3 = newline;
  if (pcVar2 == pcVar4) {
    buf_local.m_len._7_1_ = 0;
  }
  else {
    pcVar2 = span<const_char>::end((span<const_char> *)&this_local);
    size._7_1_ = 10;
    pcVar2 = ::std::find<char_const*,char>(pcVar3,pcVar2,(char *)((long)&size + 7));
    local_48 = pcVar2;
    pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
    if (pcVar2 == pcVar3) {
      buf_local.m_len._7_1_ = 0;
    }
    else {
      pcVar2 = local_48 + 1;
      local_48 = pcVar2;
      pcVar3 = span<const_char>::data((span<const_char> *)&this_local);
      *(int *)pos = (int)pcVar2 - (int)pcVar3;
      i = (char *)0x0;
      for (pcStack_60 = newline; pcStack_60 != local_48; pcStack_60 = pcStack_60 + 1) {
        if ((*pcStack_60 != '\r') && (*pcStack_60 != '\n')) {
          if (*pcStack_60 == ';') break;
          tail_headers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
               hex_to_int(*pcStack_60);
          if (tail_headers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 0) {
            header_size_local[0] = -1;
            header_size_local[1] = -1;
            buf_local.m_len._7_1_ = 1;
            goto LAB_003b1ca8;
          }
          lVar5 = ::std::numeric_limits<long>::max();
          if (lVar5 / 0x10 <= (long)i) {
            header_size_local[0] = -1;
            header_size_local[1] = -1;
            buf_local.m_len._7_1_ = 1;
            goto LAB_003b1ca8;
          }
          i = (char *)((long)tail_headers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
                      (long)i * 0x10);
        }
      }
      *(char **)header_size_local = i;
      if (*(long *)header_size_local == 0) {
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98);
        pcVar2 = local_48;
        newline = local_48;
        pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
        local_99 = '\n';
        local_48 = ::std::find<char_const*,char>(pcVar2,pcVar3,&local_99);
        ::std::__cxx11::string::string((string *)&line_end);
LAB_003b17e4:
        pcVar2 = local_48;
        pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
        if (pcVar2 == pcVar3) {
          buf_local.m_len._7_1_ = 0;
        }
        else {
          separator = (size_type)local_48;
          if ((newline != local_48) && (local_48[-1] == '\r')) {
            separator = (size_type)(local_48 + -1);
          }
          ::std::__cxx11::string::assign<char_const*,void>
                    ((string *)&line_end,newline,(char *)separator);
          local_48 = local_48 + 1;
          newline = local_48;
          __range4 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)::std::__cxx11::string::find((char)&line_end,0x3a);
          pcVar2 = local_48;
          if (__range4 !=
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0xffffffffffffffff) goto LAB_003b19ab;
          pcVar3 = span<const_char>::data((span<const_char> *)&this_local);
          *(int *)pos = (int)pcVar2 - (int)pcVar3;
          __end4 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_98);
          p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_98);
          while (bVar1 = ::std::operator!=(&__end4,(_Self *)&p), bVar1) {
            __x = ::std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end4);
            ::std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(&this->m_header,__x);
            ::std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator++(&__end4);
          }
          buf_local.m_len._7_1_ = 1;
        }
        name.field_2._12_4_ = 1;
        ::std::__cxx11::string::~string((string *)&line_end);
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_98);
      }
      else {
        buf_local.m_len._7_1_ = 1;
      }
    }
  }
LAB_003b1ca8:
  return (bool)(buf_local.m_len._7_1_ & 1);
LAB_003b19ab:
  ::std::__cxx11::string::substr((ulong)local_130,(ulong)&line_end);
  __first._M_current = (char *)::std::__cxx11::string::begin();
  __last._M_current = (char *)::std::__cxx11::string::end();
  __result._M_current = (char *)::std::__cxx11::string::begin();
  value.field_2._8_8_ =
       ::std::
       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                 (__first,__last,__result,to_lower);
  do {
    __range4 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&(__range4->_M_t)._M_impl.field_0x1;
    pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)::std::__cxx11::string::size();
    bVar1 = false;
    if (__range4 < pmVar6) {
      pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&line_end);
      bVar1 = true;
      if (*pcVar2 != ' ') {
        pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)&line_end);
        bVar1 = *pcVar2 == '\t';
      }
    }
  } while (bVar1);
  ::std::__cxx11::string::substr((ulong)local_170,(ulong)&line_end);
  ::std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
            (&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  _Var7 = ::std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_98,&local_1b0);
  local_1c0 = (_Base_ptr)_Var7.first._M_node;
  local_1b8 = _Var7.second;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_1b0);
  pcVar2 = newline;
  pcVar3 = span<const_char>::end((span<const_char> *)&this_local);
  local_1c1 = '\n';
  local_48 = ::std::find<char_const*,char>(pcVar2,pcVar3,&local_1c1);
  ::std::__cxx11::string::~string((string *)local_170);
  ::std::__cxx11::string::~string((string *)local_130);
  goto LAB_003b17e4;
}

Assistant:

bool http_parser::parse_chunk_header(span<char const> buf
		, std::int64_t* chunk_size, int* header_size)
	{
		char const* pos = buf.data();

		// ignore one optional new-line. This is since each chunk
		// is terminated by a newline. we're likely to see one
		// before the actual header.

		if (pos < buf.end() && pos[0] == '\r') ++pos;
		if (pos < buf.end() && pos[0] == '\n') ++pos;
		if (pos == buf.end()) return false;

		TORRENT_ASSERT(pos <= buf.end());
		char const* newline = std::find(pos, buf.end(), '\n');
		if (newline == buf.end()) return false;
		++newline;

		// the chunk header is a single line, a hex length of the
		// chunk followed by an optional semi-colon with a comment
		// in case the length is 0, the stream is terminated and
		// there are extra tail headers, which is terminated by an
		// empty line

		*header_size = int(newline - buf.data());

		// first, read the chunk length
		std::int64_t size = 0;
		for (char const* i = pos; i != newline; ++i)
		{
			if (*i == '\r') continue;
			if (*i == '\n') continue;
			if (*i == ';') break;
			int const digit = aux::hex_to_int(*i);
			if (digit < 0)
			{
				*chunk_size = -1;
				return true;
			}
			if (size >= std::numeric_limits<std::int64_t>::max() / 16)
			{
				*chunk_size = -1;
				return true;
			}
			size *= 16;
			size += digit;
		}
		*chunk_size = size;

		if (*chunk_size != 0)
		{
			// the newline is at least 1 byte, and the length-prefix is at least 1
			// byte
			TORRENT_ASSERT(newline - buf.data() >= 2);
			return true;
		}

		// this is the terminator of the stream. Also read headers
		std::map<std::string, std::string> tail_headers;
		pos = newline;
		newline = std::find(pos, buf.end(), '\n');

		std::string line;
		while (newline != buf.end())
		{
			// if the LF character is preceded by a CR
			// character, don't copy it into the line string.
			char const* line_end = newline;
			if (pos != line_end && *(line_end - 1) == '\r') --line_end;
			line.assign(pos, line_end);
			++newline;
			pos = newline;

			std::string::size_type separator = line.find(':');
			if (separator == std::string::npos)
			{
				// this means we got a blank line,
				// the header is finished and the body
				// starts.
				*header_size = int(newline - buf.data());

				// the newline alone is two bytes
				TORRENT_ASSERT(newline - buf.data() > 2);

				// we were successful in parsing the headers.
				// add them to the headers in the parser
				for (auto const& p : tail_headers)
					m_header.insert(p);

				return true;
			}

			std::string name = line.substr(0, separator);
			std::transform(name.begin(), name.end(), name.begin(), &to_lower);
			++separator;
			// skip whitespace
			while (separator < line.size()
				&& (line[separator] == ' ' || line[separator] == '\t'))
				++separator;
			std::string value = line.substr(separator, std::string::npos);
			tail_headers.insert(std::make_pair(name, value));
//			std::fprintf(stderr, "tail_header: %s: %s\n", name.c_str(), value.c_str());

			newline = std::find(pos, buf.end(), '\n');
		}
		return false;
	}